

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

bool intUserDataNotNull(HighsLogOptions *log_options,HighsInt *user_data,string *name)

{
  undefined8 uVar1;
  long in_RSI;
  HighsLogOptions *in_RDI;
  bool null_data;
  
  if (in_RSI == 0) {
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,"User-supplied %s are NULL\n",uVar1);
  }
  return in_RSI == 0;
}

Assistant:

bool intUserDataNotNull(const HighsLogOptions& log_options,
                        const HighsInt* user_data, const std::string name) {
  bool null_data = false;
  if (user_data == NULL) {
    highsLogUser(log_options, HighsLogType::kError,
                 "User-supplied %s are NULL\n", name.c_str());
    null_data = true;
  }
  assert(!null_data);
  return null_data;
}